

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall asl::PacketSocket_::readFrom(PacketSocket_ *this,InetAddress *a,void *data,int n)

{
  int *piVar1;
  undefined2 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  uchar *puVar5;
  sockaddr *__addr;
  ByteArray BVar6;
  ssize_t sVar7;
  socklen_t len;
  InetAddress local_38;
  
  if (*(int *)&(this->super_Socket_).super_SmartObject_.field_0xc < 0) {
    Socket_::init(&this->super_Socket_,(EVP_PKEY_CTX *)0x0);
  }
  InetAddress::InetAddress(&local_38,(this->super_Socket_)._family);
  puVar5 = (a->_data)._a;
  if (puVar5 != local_38._data._a) {
    LOCK();
    piVar1 = (int *)(puVar5 + -8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      free((a->_data)._a + -0x10);
      (a->_data)._a = (uchar *)0x0;
    }
    (a->_data)._a = local_38._data._a;
    LOCK();
    *(int *)(local_38._data._a + -8) = *(int *)(local_38._data._a + -8) + 1;
    UNLOCK();
  }
  a->_type = local_38._type;
  LOCK();
  piVar1 = (int *)(local_38._data._a + -8);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 == 0) {
    free(local_38._data._a + -0x10);
    local_38._data._a = (uchar *)0x0;
  }
  BVar6._a = local_38._data._a;
  __addr = (sockaddr *)(a->_data)._a;
  uVar2 = __addr[-1].sa_family;
  uVar3 = __addr[-1].sa_data[0];
  uVar4 = __addr[-1].sa_data[1];
  local_38._data._a._3_1_ = uVar4;
  local_38._data._a._2_1_ = uVar3;
  local_38._data._a._0_2_ = uVar2;
  local_38._data._a._4_4_ = SUB84(BVar6._a,4);
  sVar7 = recvfrom(*(int *)&(this->super_Socket_).super_SmartObject_.field_0xc,data,(long)n,0,__addr
                   ,(socklen_t *)&local_38);
  return (int)sVar7;
}

Assistant:

int PacketSocket_::readFrom(InetAddress& a, void* data, int n)
{
	if (_handle < 0)
		init();
	a = InetAddress(_family);
	socklen_t len = (socklen_t)a.length();
	int r= recvfrom(_handle, (char*)data, n, 0, (sockaddr*)a.ptr(), &len);
	return r;
}